

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  pointer pbVar2;
  undefined8 target;
  bool bVar3;
  TargetType targetType;
  string *psVar4;
  reference pbVar5;
  type pcVar6;
  cmGeneratorTarget *pcVar7;
  pointer this_01;
  iterator __first;
  iterator __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_771;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  iterator local_748;
  size_type local_740;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_720;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_710;
  undefined1 local_6f0 [8];
  string compileCmd;
  string local_6b0;
  allocator<char> local_689;
  string local_688;
  undefined1 local_668 [8];
  string flags;
  string local_640;
  undefined1 local_620 [8];
  string linkFlags;
  RuleVariables vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  iterator local_478;
  size_type local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  undefined1 local_450 [8];
  string fatbinaryOutputRel;
  string fatbinaryOutput;
  string local_408;
  undefined1 local_3e8 [8];
  string fatbinaryCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  iterator local_398;
  size_type local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  string_view local_370;
  string_view local_360;
  string local_350;
  allocator<char> local_329;
  string local_328;
  undefined1 local_308 [8];
  string command;
  undefined1 local_2c8 [8];
  string cubin;
  string architecture;
  undefined1 local_268 [8];
  string registerFileRel;
  string registerFileCmd;
  string *architectureKind;
  iterator __end1;
  iterator __begin1;
  cmList *__range1;
  string registerFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  string profiles;
  undefined1 local_190 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string relObjectDir;
  string objectDir;
  undefined1 local_128 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string *relPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  cmList architectures;
  cmLocalUnixMakefileGenerator3 *localGen;
  string local_a8;
  string_view local_88;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string architecturesStr;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  architecturesStr.field_2._8_8_ = output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CUDA_ARCHITECTURES",&local_61);
  psVar4 = cmGeneratorTarget::GetSafeProperty(pcVar7,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_88 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  bVar3 = cmIsOff(local_88);
  if (bVar3) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.",
               (allocator<char> *)((long)&localGen + 7));
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&localGen + 7));
    localGen._0_4_ = 1;
  }
  else {
    architectures.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_100,local_40);
    local_e0 = &local_100;
    local_d8 = 1;
    init._M_len = 1;
    init._M_array = local_e0;
    cmList::cmList((cmList *)local_d0,init);
    local_7c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
    do {
      local_7c8 = local_7c8 + -1;
      std::__cxx11::string::~string((string *)local_7c8);
    } while (local_7c8 != &local_100);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_
                   ((cmLocalUnixMakefileGenerator3 *)
                    architectures.Values.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    objectDir.field_2._8_8_ = this;
    WriteDeviceLinkRule(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128,(void *)((long)&objectDir.field_2 + 8));
    std::__cxx11::string::string
              ((string *)(relObjectDir.field_2._M_local_buf + 8),
               (string *)&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmOutputConverter *)
               architectures.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)((long)&relObjectDir.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_190);
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)((long)&profiles.field_2 + 8),
               (cmOutputConverter *)
               architectures.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)architecturesStr.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_190,(value_type *)((long)&profiles.field_2 + 8));
    std::__cxx11::string::~string((string *)(profiles.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&registerFile.field_2 + 8));
    cmStrCat<std::__cxx11::string_const&,char_const(&)[22]>
              ((string *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&relObjectDir.field_2 + 8),(char (*) [22])0x101aa3a);
    __end1 = cmList::begin_abi_cxx11_((cmList *)local_d0);
    architectureKind = (string *)cmList::end_abi_cxx11_((cmList *)local_d0);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&architectureKind);
      if (!bVar3) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)(registerFileRel.field_2._M_local_buf + 8));
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&registerFile.field_2 + 8));
      if (bVar3) {
        cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[22]>
                  ((string *)local_268,
                   linkDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cleanFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [22])0x101aa3a);
        cmStrCat<char_const(&)[27],std::__cxx11::string_const&>
                  ((string *)((long)&architecture.field_2 + 8),
                   (char (*) [27])" --register-link-binaries=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
        std::__cxx11::string::operator=
                  ((string *)(registerFileRel.field_2._M_local_buf + 8),
                   (string *)(architecture.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(architecture.field_2._M_local_buf + 8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_190,(value_type *)local_268);
        std::__cxx11::string::~string((string *)local_268);
      }
      std::__cxx11::string::find((char)pbVar5,0x2d);
      std::__cxx11::string::substr((ulong)((long)&cubin.field_2 + 8),(ulong)pbVar5);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[7]>
                ((string *)local_2c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&relObjectDir.field_2 + 8),(char (*) [4])0x101aa2e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cubin.field_2 + 8),(char (*) [7])".cubin");
      cmStrCat<char_const(&)[17],std::__cxx11::string_const&,char_const(&)[7],std::__cxx11::string_const&>
                ((string *)((long)&command.field_2 + 8),(char (*) [17])" -im=profile=sm_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cubin.field_2 + 8),(char (*) [7])",file=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
      std::__cxx11::string::operator+=
                ((string *)
                 &fatbinaryDepends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (registerFile.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8);
      pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"CMAKE_CUDA_DEVICE_LINKER",&local_329);
      psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_328);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_360," ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_370);
      cmJoin(&local_350,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_128,local_360,local_370);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[11],std::__cxx11::string_const&,std::__cxx11::string&,char_const(&)[8],std::__cxx11::string>
                ((string *)local_308,psVar4,(char (*) [11])" -arch=sm_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cubin.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&registerFileRel.field_2 + 8),(char (*) [8])" -o=$@ ",&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      pbVar2 = architectures.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      std::__cxx11::string::string((string *)&local_3b8,(string *)local_308);
      local_398 = &local_3b8;
      local_390 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      __l_01._M_len = local_390;
      __l_01._M_array = local_398;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_388,__l_01,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
                 (string *)local_2c8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_128,&local_388,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      local_858 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_398;
      do {
        local_858 = local_858 + -1;
        std::__cxx11::string::~string((string *)local_858);
      } while (local_858 != &local_3b8);
      std::__cxx11::string::~string((string *)local_308);
      std::__cxx11::string::~string((string *)local_2c8);
      std::__cxx11::string::~string((string *)(cubin.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(registerFileRel.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"CMAKE_CUDA_FATBINARY",
               (allocator<char> *)(fatbinaryOutput.field_2._M_local_buf + 0xf));
    psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_408);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[70],std::__cxx11::string&>
              ((string *)local_3e8,psVar4,
               (char (*) [70])
               " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$@",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator
              ((allocator<char> *)(fatbinaryOutput.field_2._M_local_buf + 0xf));
    cmStrCat<std::__cxx11::string_const&,char_const(&)[20]>
              ((string *)((long)&fatbinaryOutputRel.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&relObjectDir.field_2 + 8),(char (*) [20])0x101aa69);
    cmStrCat<std::__cxx11::string_const&,std::__cxx11::string_const&,char_const(&)[20]>
              ((string *)local_450,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(char (*) [20])0x101aa69);
    pbVar2 = architectures.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    std::__cxx11::string::string((string *)&local_498,(string *)local_3e8);
    local_478 = &local_498;
    local_470 = 1;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&vars.Launcher + 7);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l_00._M_len = local_470;
    __l_00._M_array = local_478;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_468,__l_00,this_00);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
               (string *)local_450,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&registerFile.field_2 + 8),&local_468,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_468);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&vars.Launcher + 7));
    local_8c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_478;
    do {
      local_8c8 = local_8c8 + -1;
      std::__cxx11::string::~string((string *)local_8c8);
    } while (local_8c8 != &local_498);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&linkFlags.field_2 + 8));
    pcVar7 = GetGeneratorTarget(this);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar7);
    linkFlags.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar7 = GetGeneratorTarget(this);
    targetType = cmGeneratorTarget::GetType(pcVar7);
    cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetName = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMinor = "CUDA";
    vars.Output = (char *)std::__cxx11::string::c_str();
    vars.CudaCompileMode = (char *)std::__cxx11::string::c_str();
    vars.Fatbinary = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_620);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"CUDA",(allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    GetDeviceLinkFlags(this,(string *)local_620,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    vars.Linker = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"CUDA",&local_689);
    GetConfigName_abi_cxx11_(&local_6b0,this);
    std::__cxx11::string::string((string *)(compileCmd.field_2._M_local_buf + 8));
    cmCommonTargetGenerator::GetFlags
              ((string *)local_668,&this->super_cmCommonTargetGenerator,&local_688,&local_6b0,
               (string *)(compileCmd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(compileCmd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
    vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"CMAKE_CUDA_DEVICE_LINK_COMPILE",
               (allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    GetLinkRule((string *)local_6f0,this,&local_710);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    (**(code **)(*(long *)architectures.Values.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x30))(&local_720);
    this_01 = std::
              unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
              ::operator->(&local_720);
    cmRulePlaceholderExpander::ExpandRuleVariables
              (this_01,(cmOutputConverter *)
                       architectures.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_6f0,
               (RuleVariables *)((long)&linkFlags.field_2 + 8));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6f0);
    pbVar2 = architectures.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    target = architecturesStr.field_2._8_8_;
    local_770 = &local_768;
    std::__cxx11::string::string((string *)local_770,(string *)local_450);
    local_748 = &local_768;
    local_740 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_771);
    __l._M_len = local_740;
    __l._M_array = local_748;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_738,__l,&local_771);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
               (string *)target,&local_738,commands,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_738);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_771);
    local_950 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_748;
    do {
      local_950 = local_950 + -1;
      std::__cxx11::string::~string((string *)local_950);
    } while (local_950 != &local_768);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_190);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_190);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr(&local_720);
    std::__cxx11::string::~string((string *)local_6f0);
    std::__cxx11::string::~string((string *)local_668);
    std::__cxx11::string::~string((string *)local_620);
    std::__cxx11::string::~string((string *)local_450);
    std::__cxx11::string::~string((string *)(fatbinaryOutputRel.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_3e8);
    std::__cxx11::string::~string((string *)&__range1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&registerFile.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_190);
    std::__cxx11::string::~string
              ((string *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(relObjectDir.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
    cmList::~cmList((cmList *)local_d0);
    localGen._0_4_ = 0;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  cmList architectures{ architecturesStr };
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> const depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string const flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  auto rulePlaceholderExpander = localGen->CreateRulePlaceholderExpander();
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}